

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_0::DatagramPortImpl::ReceiverImpl::receive(ReceiverImpl *this)

{
  PromiseFulfiller<void> *pPVar1;
  PromiseArena *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  undefined1 auVar7 [8];
  Fault node;
  char cVar8;
  int iVar9;
  ssize_t sVar10;
  void *pvVar11;
  ulong uVar12;
  undefined8 *puVar13;
  cmsghdr *__cmsg;
  undefined8 *puVar14;
  ulong uVar15;
  PromiseArena *in_RSI;
  size_t newSize;
  byte *pos;
  Exception *this_00;
  undefined4 uVar16;
  undefined4 uVar17;
  Fault f;
  iovec iov;
  sockaddr_storage addr;
  undefined1 local_140 [8];
  Fault local_138;
  undefined1 local_130 [8];
  PromiseFulfiller<void> *local_128;
  iovec *piStack_120;
  PromiseFulfiller<void> *local_118;
  cmsghdr *pcStack_110;
  PromiseFulfiller<void> *local_108;
  Disposer *pDStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  SourceLocation local_e8;
  iovec local_c8;
  Disposer local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pDStack_100 = (Disposer *)0x0;
  local_130 = (undefined1  [8])&local_b8;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8._vptr_Disposer = (_func_int **)0x0;
  uStack_b0 = 0;
  local_128 = (PromiseFulfiller<void> *)0x80;
  local_c8.iov_base = *(void **)(in_RSI->bytes + 0x10);
  piStack_120 = &local_c8;
  local_c8.iov_len = *(size_t *)(in_RSI->bytes + 0x18);
  local_118 = (PromiseFulfiller<void> *)0x1;
  pcStack_110 = *(cmsghdr **)(in_RSI->bytes + 0x28);
  local_108 = *(PromiseFulfiller<void> **)(in_RSI->bytes + 0x30);
  while (sVar10 = recvmsg(*(int *)(*(long *)(in_RSI->bytes + 8) + 8),(msghdr *)local_130,0),
        sVar10 < 0) {
    iVar9 = kj::_::Debug::getOsErrorNumber(true);
    if (iVar9 != -1) {
      if (iVar9 == 0) {
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_140);
        auVar7 = local_140;
        pPVar2 = (PromiseArena *)
                 ((SleepHooks *)&((PromiseArenaMember *)local_140)->arena)->_vptr_SleepHooks;
        if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_140 - (long)pPVar2) < 0x28) {
          pvVar11 = operator_new(0x400);
          this_00 = (Exception *)((long)pvVar11 + 0x3d8);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)local_140,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1868:55)>
                     ::anon_class_8_1_8991fb9c_for_func::operator());
          *(undefined ***)((long)pvVar11 + 0x3d8) = &PTR_destroy_006e2660;
          *(PromiseArena **)((long)pvVar11 + 0x3f8) = in_RSI;
          *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
        }
        else {
          ((SleepHooks *)&((PromiseArenaMember *)local_140)->arena)->_vptr_SleepHooks =
               (_func_int **)0x0;
          this_00 = (Exception *)&((PromiseArenaMember *)((long)local_140 + -0x30))->arena;
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)local_140,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1868:55)>
                     ::anon_class_8_1_8991fb9c_for_func::operator());
          ((PromiseArenaMember *)((long)auVar7 + -0x30))->arena =
               (PromiseArena *)&PTR_destroy_006e2660;
          ((PromiseArenaMember *)((long)auVar7 + -0x10))->arena = in_RSI;
          ((PromiseArenaMember *)((long)auVar7 + -0x20))->_vptr_PromiseArenaMember =
               (_func_int **)pPVar2;
        }
        local_e8.fileName =
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
        ;
        local_e8.function = "then";
        local_e8.lineNumber = 0x58b;
        local_e8.columnNumber = 0x4c;
        local_138.exception = this_00;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)this,(OwnPromiseNode *)&local_138,&local_e8);
        node.exception = local_138.exception;
        if (local_138.exception != (Exception *)0x0) {
          local_138.exception = (Exception *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
        }
        auVar7 = local_140;
        if (local_140 != (undefined1  [8])0x0) {
          local_140 = (undefined1  [8])0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar7);
        }
        return (PromiseBase)(PromiseBase)this;
      }
      local_138.exception = (Exception *)0x0;
      local_e8.fileName = (char *)0x0;
      local_e8.function = (char *)0x0;
      kj::_::Debug::Fault::init
                (&local_138,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_138);
    }
  }
  puVar13 = *(undefined8 **)(*(long *)(in_RSI->bytes + 8) + 0x20);
  cVar8 = (**(code **)*puVar13)(puVar13,local_130,(ulong)local_128 & 0xffffffff);
  if (cVar8 == '\0') {
    receive(this);
    return (PromiseBase)(PromiseBase)this;
  }
  *(ssize_t *)(in_RSI->bytes + 0x60) = sVar10;
  in_RSI->bytes[0x68] = (byte)pDStack_100 >> 5 & 1;
  uVar3 = *(undefined8 *)(*(long *)(in_RSI->bytes + 8) + 0x10);
  uVar4 = *(undefined8 *)(*(long *)(in_RSI->bytes + 8) + 0x20);
  if (in_RSI->bytes[0x70] == '\x01') {
    in_RSI->bytes[0x70] = '\0';
    lVar5 = *(long *)(in_RSI->bytes + 0x118);
    if (lVar5 != 0) {
      uVar6 = *(undefined8 *)(in_RSI->bytes + 0x120);
      in_RSI->bytes[0x118] = '\0';
      in_RSI->bytes[0x119] = '\0';
      in_RSI->bytes[0x11a] = '\0';
      in_RSI->bytes[0x11b] = '\0';
      in_RSI->bytes[0x11c] = '\0';
      in_RSI->bytes[0x11d] = '\0';
      in_RSI->bytes[0x11e] = '\0';
      in_RSI->bytes[0x11f] = '\0';
      in_RSI->bytes[0x120] = '\0';
      in_RSI->bytes[0x121] = '\0';
      in_RSI->bytes[0x122] = '\0';
      in_RSI->bytes[0x123] = '\0';
      in_RSI->bytes[0x124] = '\0';
      in_RSI->bytes[0x125] = '\0';
      in_RSI->bytes[0x126] = '\0';
      in_RSI->bytes[0x127] = '\0';
      (**(code **)**(undefined8 **)(in_RSI->bytes + 0x128))
                (*(undefined8 **)(in_RSI->bytes + 0x128),lVar5,0x88,uVar6,uVar6,0);
    }
    AsyncObject::~AsyncObject((AsyncObject *)(in_RSI->bytes + 0x100));
  }
  SocketAddress::SocketAddress
            ((SocketAddress *)(in_RSI->bytes + 0x78),(void *)local_130,(uint)local_128);
  *(undefined ***)(in_RSI->bytes + 0x100) = &PTR_connect_006e1b90;
  *(undefined8 *)(in_RSI->bytes + 0x108) = uVar3;
  *(undefined8 *)(in_RSI->bytes + 0x110) = uVar4;
  *(SocketAddress **)(in_RSI->bytes + 0x118) = (SocketAddress *)(in_RSI->bytes + 0x78);
  in_RSI->bytes[0x120] = '\x01';
  in_RSI->bytes[0x121] = '\0';
  in_RSI->bytes[0x122] = '\0';
  in_RSI->bytes[0x123] = '\0';
  in_RSI->bytes[0x124] = '\0';
  in_RSI->bytes[0x125] = '\0';
  in_RSI->bytes[0x126] = '\0';
  in_RSI->bytes[0x127] = '\0';
  *(undefined8 **)(in_RSI->bytes + 0x128) = &NullArrayDisposer::instance;
  in_RSI->bytes[0x130] = '\0';
  in_RSI->bytes[0x131] = '\0';
  in_RSI->bytes[0x132] = '\0';
  in_RSI->bytes[0x133] = '\0';
  in_RSI->bytes[0x70] = '\x01';
  puVar13 = *(undefined8 **)(in_RSI->bytes + 0x40);
  puVar14 = *(undefined8 **)(in_RSI->bytes + 0x48);
  if (puVar14 < puVar13) {
    do {
      *(undefined8 **)(in_RSI->bytes + 0x48) = puVar14 + 3;
      *puVar14 = 0;
      puVar14[1] = 0;
      puVar14[2] = 0;
      puVar14 = *(undefined8 **)(in_RSI->bytes + 0x48);
    } while (puVar14 < puVar13);
  }
  else {
    *(undefined8 **)(in_RSI->bytes + 0x48) = puVar13;
  }
  in_RSI->bytes[0x69] = (byte)pDStack_100 >> 3 & 1;
  if (pcStack_110 != (cmsghdr *)0x0 && (PromiseFulfiller<void> *)0xf < local_108) {
    __cmsg = pcStack_110;
    do {
      uVar12 = (*(long *)(in_RSI->bytes + 0x28) + *(long *)(in_RSI->bytes + 0x30)) - (long)__cmsg;
      if (uVar12 < 0x10) break;
      uVar15 = __cmsg->cmsg_len;
      if (uVar12 < __cmsg->cmsg_len) {
        uVar15 = uVar12;
      }
      pPVar1 = *(PromiseFulfiller<void> **)&__cmsg->cmsg_level;
      puVar13 = *(undefined8 **)(in_RSI->bytes + 0x48);
      uVar16 = (int)pPVar1;
      uVar17 = (int)((ulong)pPVar1 >> 0x20);
      if (puVar13 == *(undefined8 **)(in_RSI->bytes + 0x50)) {
        newSize = ((long)puVar13 - (long)*(undefined8 **)(in_RSI->bytes + 0x40) >> 3) *
                  0x5555555555555556;
        if (puVar13 == *(undefined8 **)(in_RSI->bytes + 0x40)) {
          newSize = 4;
        }
        uStack_f0._0_1_ = false;
        uStack_f0._1_1_ = (anon_union_1_1_a8c68091_for_NullableValue<bool>_2)0x0;
        uStack_f0._2_6_ = 0;
        local_f8 = pPVar1;
        Vector<kj::AncillaryMessage>::setCapacity
                  ((Vector<kj::AncillaryMessage> *)(in_RSI->bytes + 0x40),newSize);
        puVar13 = *(undefined8 **)(in_RSI->bytes + 0x48);
        uVar16 = (undefined4)local_f8;
        uVar17 = local_f8._4_4_;
      }
      *puVar13 = CONCAT44(uVar17,uVar16);
      puVar13[1] = __cmsg + 1;
      puVar13[2] = uVar15 - 0x10;
      *(long *)(in_RSI->bytes + 0x48) = *(long *)(in_RSI->bytes + 0x48) + 0x18;
      __cmsg = __cmsg_nxthdr((msghdr *)local_130,__cmsg);
    } while (__cmsg != (cmsghdr *)0x0);
  }
  kj::_::readyNow();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> receive() override {
    struct msghdr msg;
    memset(&msg, 0, sizeof(msg));

    struct sockaddr_storage addr;
    memset(&addr, 0, sizeof(addr));
    msg.msg_name = &addr;
    msg.msg_namelen = sizeof(addr);

    struct iovec iov;
    iov.iov_base = contentBuffer.begin();
    iov.iov_len = contentBuffer.size();
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;
    msg.msg_control = ancillaryBuffer.begin();
    msg.msg_controllen = ancillaryBuffer.size();

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = recvmsg(port.fd, &msg, 0));

    if (n < 0) {
      // No data available. Wait.
      return port.observer.whenBecomesReadable().then([this]() {
        return receive();
      });
    } else {
      if (!port.filter.shouldAllow(reinterpret_cast<const struct sockaddr*>(msg.msg_name),
                                   msg.msg_namelen)) {
        // Ignore message from disallowed source.
        return receive();
      }

      receivedSize = n;
      contentTruncated = msg.msg_flags & MSG_TRUNC;

      source.emplace(port.lowLevel, port.filter, msg.msg_name, msg.msg_namelen);

      ancillaryList.resize(0);
      ancillaryTruncated = msg.msg_flags & MSG_CTRUNC;

      for (struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg); cmsg != nullptr;
           cmsg = CMSG_NXTHDR(&msg, cmsg)) {
        // On some platforms (OSX), a cmsghdr's length may cross the end of the ancillary buffer
        // when truncated. On other platforms (Linux) the length in cmsghdr will itself be
        // truncated to fit within the buffer.

#if __APPLE__
// On MacOS, `CMSG_SPACE(0)` triggers a bogus warning.
#pragma GCC diagnostic ignored "-Wnull-pointer-arithmetic"
#endif
        const byte* pos = reinterpret_cast<const byte*>(cmsg);
        size_t available = ancillaryBuffer.end() - pos;
        if (available < CMSG_SPACE(0)) {
          // The buffer ends in the middle of the header. We can't use this message.
          // (On Linux, this never happens, because the message is not included if there isn't
          // space for a header. I'm not sure how other systems behave, though, so let's be safe.)
          break;
        }

        // OK, we know the cmsghdr is valid, at least.

        // Find the start of the message payload.
        const byte* begin = (const byte *)CMSG_DATA(cmsg);

        // Cap the message length to the available space.
        const byte* end = pos + kj::min(available, cmsg->cmsg_len);

        ancillaryList.add(AncillaryMessage(
            cmsg->cmsg_level, cmsg->cmsg_type, arrayPtr(begin, end)));
      }

      return READY_NOW;
    }
  }